

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_matrix.cpp
# Opt level: O0

void __thiscall neural_networks::utilities::NeuralMatrix::~NeuralMatrix(NeuralMatrix *this)

{
  NeuralMatrix *this_local;
  
  ~NeuralMatrix(this);
  operator_delete(this);
  return;
}

Assistant:

neural_networks::utilities::NeuralMatrix::~NeuralMatrix() {
    register size_t i, j;
    // size_t sum = 0;
    for(i = 0; i < N; ++i) {
        for(j = 0; j < M; ++j) {
            // sum += sizeof(matrix[i][j]);
            delete matrix[i][j];
            matrix[i][j] = nullptr;
        }
    }
    // std::cout << "Freed " << sum << "B of memory at " << this << "\n";
}